

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlHashedString htmlParseAttribute(htmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlChar *pxVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  int maxLength;
  xmlHashedString xVar4;
  
  *value = (xmlChar *)0x0;
  xVar4 = htmlParseHTMLName(ctxt,1);
  if (xVar4.name == (xmlChar *)0x0) goto LAB_0016989d;
  htmlSkipBlankChars(ctxt);
  pxVar2 = ctxt->input;
  if (*pxVar2->cur == '=') {
    pxVar2->cur = pxVar2->cur + 1;
    pxVar2->col = pxVar2->col + 1;
    htmlSkipBlankChars(ctxt);
    maxLength = 1000000000;
    if ((ctxt->options & 0x80000) == 0) {
      maxLength = 10000000;
    }
    pxVar2 = ctxt->input;
    pxVar1 = pxVar2->cur;
    if (*pxVar1 == '\'') {
      pxVar2->cur = pxVar1 + 1;
      pxVar2->col = pxVar2->col + 1;
      pxVar1 = htmlParseData(ctxt,MASK_SQ,0,1,maxLength);
      pxVar2 = ctxt->input;
      pxVar3 = pxVar2->cur;
      if (*pxVar3 == '\'') {
LAB_00169878:
        pxVar2->cur = pxVar3 + 1;
        pxVar2->col = pxVar2->col + 1;
      }
    }
    else if (*pxVar1 == '\"') {
      pxVar2->cur = pxVar1 + 1;
      pxVar2->col = pxVar2->col + 1;
      pxVar1 = htmlParseData(ctxt,MASK_DQ,0,1,maxLength);
      pxVar2 = ctxt->input;
      pxVar3 = pxVar2->cur;
      if (*pxVar3 == '\"') goto LAB_00169878;
    }
    else {
      pxVar1 = htmlParseData(ctxt,MASK_WS_GT,0,1,maxLength);
    }
  }
  else {
    pxVar1 = (xmlChar *)0x0;
  }
  *value = pxVar1;
LAB_0016989d:
  xVar4._4_4_ = 0;
  return xVar4;
}

Assistant:

static xmlHashedString
htmlParseAttribute(htmlParserCtxtPtr ctxt, xmlChar **value) {
    xmlHashedString hname;
    xmlChar *val = NULL;

    *value = NULL;
    hname = htmlParseHTMLName(ctxt, 1);
    if (hname.name == NULL)
        return(hname);

    /*
     * read the value
     */
    SKIP_BLANKS;
    if (CUR == '=') {
        SKIP(1);
	SKIP_BLANKS;
	val = htmlParseAttValue(ctxt);
    }

    *value = val;
    return(hname);
}